

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::
RemoveCurrent<Memory::HeapAllocator>(EditingIterator *this,HeapAllocator *allocator)

{
  RealCount *pRVar1;
  DListNodeBase<Memory::Recycler::GuestArenaAllocator> *pDVar2;
  DListNodeBase<Memory::Recycler::GuestArenaAllocator> *pDVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  DListNode<Memory::Recycler::GuestArenaAllocator> *obj;
  
  obj = (DListNode<Memory::Recycler::GuestArenaAllocator> *)(this->super_Iterator).current;
  if (obj == (DListNode<Memory::Recycler::GuestArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x94,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar5) goto LAB_0068bac7;
    *puVar6 = 0;
    obj = (DListNode<Memory::Recycler::GuestArenaAllocator> *)(this->super_Iterator).current;
  }
  if (obj == (DListNode<Memory::Recycler::GuestArenaAllocator> *)(this->super_Iterator).list) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x95,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar5) {
LAB_0068bac7:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
    obj = (DListNode<Memory::Recycler::GuestArenaAllocator> *)(this->super_Iterator).current;
  }
  pDVar2 = (obj->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.base;
  pDVar3 = (obj->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).prev.base;
  (pDVar3->next).base = pDVar2;
  pDVar2->prev = (obj->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).prev;
  Memory::
  DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::Recycler::GuestArenaAllocator>>
            (allocator,obj);
  (this->super_Iterator).current = pDVar3;
  pRVar1 = &((this->super_Iterator).list)->super_RealCount;
  pRVar1->count = pRVar1->count - 1;
  return;
}

Assistant:

void RemoveCurrent(TAllocator * allocator)
        {
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));

            NodeBase * last = this->current->Prev();
            NodeBase * node = const_cast<NodeBase *>(this->current);
            DListBase::RemoveNode(node);
            AllocatorDelete(TAllocator, allocator, (Node *)node);
            this->current = last;
            const_cast<DListBase *>(this->list)->DecrementCount();
        }